

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O2

void __thiscall
OSTEI_VRR_Algorithm_Base::Create_WithOrder
          (OSTEI_VRR_Algorithm_Base *this,QuartetSet *q,IdxOrder idx_order)

{
  Quartet *pQVar1;
  VRR_MReqMap *this_00;
  VRR_IntReqMap *this_01;
  int *piVar2;
  int *__v;
  RRStepType rrstep;
  int iVar3;
  _Rb_tree_color _Var4;
  int iVar5;
  int iVar6;
  bool bVar7;
  _Base_ptr p_Var8;
  size_type sVar9;
  _Rb_tree<VRRStep,VRRStep,std::_Identity<VRRStep>,std::less<VRRStep>,std::allocator<VRRStep>>
  *p_Var10;
  _Rb_tree_node_base *p_Var11;
  mapped_type *pmVar12;
  _Rb_tree<VRRStep,_VRRStep,_std::_Identity<VRRStep>,_std::less<VRRStep>,_std::allocator<VRRStep>_>
  *this_02;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *p_Var13;
  _Rb_tree_color _Var14;
  long lVar15;
  long lVar16;
  OSTEI_VRR_Algorithm_Base *pOVar17;
  value_type *it2;
  Quartet *this_03;
  _Rb_tree_node_base *__v_00;
  QuartetSet my_targets;
  QuartetSet newtargets;
  QAM qam;
  QuartetSet targets;
  QuartetSet qnew;
  QuartetSet solvedquartets;
  VRR_StepMap newmap;
  QuartetSet not_for_me;
  undefined1 local_8e8 [16];
  _Alloc_hider local_8d8;
  _Rb_tree_node_base *local_8d0;
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  _Alloc_hider local_8a8;
  _Base_ptr local_8a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_898;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_888;
  undefined1 local_878 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_868;
  _Base_ptr local_860;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_858;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_848;
  _Base_ptr local_840;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_838;
  _Base_ptr local_828;
  _Base_ptr local_820;
  undefined1 local_818 [48];
  _Base_ptr local_7e8;
  size_t local_7e0;
  undefined1 local_7d8 [80];
  _Rb_tree_node_base *local_788;
  _Base_ptr local_780;
  _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
  local_778;
  _Rb_tree<QAM,_std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>,_std::_Select1st<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>_>
  local_748;
  undefined1 local_718 [48];
  undefined1 local_6e8 [8];
  undefined1 auStack_6e0 [8];
  _Alloc_hider local_6d8;
  _Rb_tree_const_iterator<Quartet> local_6d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6c8 [6];
  int local_660;
  Quartet local_638 [8];
  Quartet local_d8;
  
  local_7e0 = idx_order._M_elems._8_8_;
  local_7e8 = idx_order._M_elems._0_8_;
  local_7d8._72_8_ = local_7d8 + 0x38;
  local_7d8._56_4_ = 0;
  local_7d8._64_8_ = 0;
  local_780 = (_Base_ptr)0x0;
  local_788 = (_Rb_tree_node_base *)local_7d8._72_8_;
  for (p_Var8 = (q->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var8 != &(q->_M_t)._M_impl.super__Rb_tree_header;
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
    Quartet::notag((Quartet *)local_6e8,(Quartet *)(p_Var8 + 1));
    std::
    _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
    ::_M_insert_unique<Quartet>
              ((_Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
                *)(local_7d8 + 0x30),(Quartet *)local_6e8);
    Quartet::~Quartet((Quartet *)local_6e8);
  }
  local_748._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_748._M_impl.super__Rb_tree_header._M_header;
  local_748._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_748._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_748._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_778._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_778._M_impl.super__Rb_tree_header._M_header;
  local_778._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_778._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_778._M_impl.super__Rb_tree_header._M_node_count = 0;
  pOVar17 = (OSTEI_VRR_Algorithm_Base *)local_7d8;
  local_778._M_impl.super__Rb_tree_header._M_header._M_right =
       local_778._M_impl.super__Rb_tree_header._M_header._M_left;
  local_748._M_impl.super__Rb_tree_header._M_header._M_right =
       local_748._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
  ::_Rb_tree((_Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
              *)pOVar17,
             (_Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
              *)(local_7d8 + 0x30));
  PruneQuartets_(pOVar17,(QuartetSet *)local_7d8);
  for (lVar15 = 0;
      (lVar15 != 4 && (rrstep = *(RRStepType *)((long)&local_7e8 + lVar15 * 4), -1 < (int)rrstep));
      lVar15 = lVar15 + 1) {
    pOVar17 = (OSTEI_VRR_Algorithm_Base *)local_7d8;
    std::
    _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
    ::_Rb_tree((_Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
                *)local_8e8,
               (_Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
                *)pOVar17);
    PruneQuartets_((QuartetSet *)local_6e8,pOVar17,(QuartetSet *)local_8e8,rrstep);
    std::
    _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
    ::operator=((_Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
                 *)local_7d8,
                (_Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
                 *)local_6e8);
    std::
    _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
    ::~_Rb_tree((_Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
                 *)local_6e8);
    while ((_Base_ptr)local_8c8._8_8_ != (_Base_ptr)0x0) {
      local_8b8._8_4_ = _S_red;
      local_8a8._M_p = (pointer)0x0;
      local_8a0 = (_Base_ptr)(local_8b8 + 8);
      local_898._8_8_ = 0;
      local_898._M_allocated_capacity = (size_type)local_8a0;
      for (p_Var11 = local_8d0; p_Var11 != (_Rb_tree_node_base *)(local_8e8 + 8);
          p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
        pQVar1 = (Quartet *)(p_Var11 + 1);
        Quartet::amlist((QAM *)local_818,pQVar1);
        Quartet::Quartet(&local_d8,pQVar1);
        Create_Single_((VRRStep *)local_6e8,this,&local_d8,rrstep);
        Quartet::~Quartet(&local_d8);
        for (lVar16 = 0xb0; lVar16 != 0x5f0; lVar16 = lVar16 + 0xa8) {
          this_03 = (Quartet *)(local_6e8 + lVar16);
          bVar7 = Quartet::operator_cast_to_bool(this_03);
          if (bVar7) {
            sVar9 = std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::count
                              ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)
                               &local_778,this_03);
            if (sVar9 == 0) {
              std::
              _Rb_tree<Quartet,Quartet,std::_Identity<Quartet>,std::less<Quartet>,std::allocator<Quartet>>
              ::_M_insert_unique<Quartet_const&>
                        ((_Rb_tree<Quartet,Quartet,std::_Identity<Quartet>,std::less<Quartet>,std::allocator<Quartet>>
                          *)local_8b8,this_03);
            }
          }
        }
        p_Var10 = (_Rb_tree<VRRStep,VRRStep,std::_Identity<VRRStep>,std::less<VRRStep>,std::allocator<VRRStep>>
                   *)std::
                     map<QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>_>
                     ::operator[]((map<QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>_>
                                   *)&local_748,(key_type *)local_818);
        std::
        _Rb_tree<VRRStep,VRRStep,std::_Identity<VRRStep>,std::less<VRRStep>,std::allocator<VRRStep>>
        ::_M_insert_unique<VRRStep_const&>(p_Var10,(VRRStep *)local_6e8);
        std::
        _Rb_tree<Quartet,Quartet,std::_Identity<Quartet>,std::less<Quartet>,std::allocator<Quartet>>
        ::_M_insert_unique<Quartet_const&>
                  ((_Rb_tree<Quartet,Quartet,std::_Identity<Quartet>,std::less<Quartet>,std::allocator<Quartet>>
                    *)&local_778,pQVar1);
        VRRStep::~VRRStep((VRRStep *)local_6e8);
        std::__cxx11::string::~string((string *)(local_818 + 0x10));
      }
      pOVar17 = (OSTEI_VRR_Algorithm_Base *)local_8b8;
      std::
      _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
      ::operator=((_Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
                   *)local_8e8,
                  (_Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
                   *)pOVar17);
      PruneQuartets_((QuartetSet *)local_6e8,pOVar17,(QuartetSet *)local_8e8,rrstep);
      std::
      _Rb_tree<Quartet,Quartet,std::_Identity<Quartet>,std::less<Quartet>,std::allocator<Quartet>>::
      _M_insert_range_unique<std::_Rb_tree_const_iterator<Quartet>>
                ((_Rb_tree<Quartet,Quartet,std::_Identity<Quartet>,std::less<Quartet>,std::allocator<Quartet>>
                  *)local_7d8,local_6d0,(_Base_ptr)auStack_6e0);
      std::
      _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
      ::~_Rb_tree((_Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
                   *)local_6e8);
      std::
      _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
      ::~_Rb_tree((_Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
                   *)local_8b8);
    }
    std::
    _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
    ::~_Rb_tree((_Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
                 *)local_8e8);
  }
  for (p_Var8 = local_778._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var8 != &local_778._M_impl.super__Rb_tree_header;
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
    Quartet::amlist((QAM *)local_6e8,(Quartet *)(p_Var8 + 1));
    std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::
    _M_insert_unique<QAM>(&(this->allam_)._M_t,(QAM *)local_6e8);
    std::__cxx11::string::~string((string *)&local_6d8);
  }
  std::__cxx11::string::string((string *)&local_848,"",(allocator *)local_8e8);
  local_6e8 = (undefined1  [8])0x0;
  auStack_6e0 = (undefined1  [8])0x0;
  if (local_848 == &local_838) {
    local_6c8[0]._8_8_ = local_838._8_8_;
    local_6d8._M_p = (pointer)local_6c8;
  }
  else {
    local_6d8._M_p = (pointer)local_848;
  }
  local_6d0._M_node = local_840;
  local_840 = (_Base_ptr)0x0;
  local_838._M_local_buf[0] = '\0';
  local_848 = &local_838;
  std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::
  _M_insert_unique<QAM>(&(this->allam_)._M_t,(QAM *)local_6e8);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::__cxx11::string::~string((string *)&local_848);
  std::__cxx11::string::string((string *)&local_868,"",(allocator *)local_8e8);
  this_00 = &this->vrrmreq_max_;
  local_6e8 = (undefined1  [8])0x0;
  auStack_6e0 = (undefined1  [8])0x0;
  if (local_868 == &local_858) {
    local_6c8[0]._8_8_ = local_858._8_8_;
    local_6d8._M_p = (pointer)local_6c8;
  }
  else {
    local_6d8._M_p = (pointer)local_868;
  }
  local_6d0._M_node = local_860;
  local_860 = (_Base_ptr)0x0;
  local_858._M_local_buf[0] = '\0';
  local_868 = &local_858;
  pmVar12 = std::map<QAM,_int,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_int>_>_>::
            operator[](this_00,(key_type *)local_6e8);
  *pmVar12 = 0;
  std::__cxx11::string::~string((string *)&local_6d8);
  std::__cxx11::string::~string((string *)&local_868);
  for (p_Var8 = local_748._M_impl.super__Rb_tree_header._M_header._M_left;
      local_6c8[0]._0_8_ = auStack_6e0,
      (_Rb_tree_header *)p_Var8 != &local_748._M_impl.super__Rb_tree_header;
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
    std::
    _Rb_tree<VRRStep,_VRRStep,_std::_Identity<VRRStep>,_std::less<VRRStep>,_std::allocator<VRRStep>_>
    ::_Rb_tree((_Rb_tree<VRRStep,_VRRStep,_std::_Identity<VRRStep>,_std::less<VRRStep>,_std::allocator<VRRStep>_>
                *)local_8e8,
               (_Rb_tree<VRRStep,_VRRStep,_std::_Identity<VRRStep>,_std::less<VRRStep>,_std::allocator<VRRStep>_>
                *)&p_Var8[2]._M_left);
    p_Var11 = local_8d0;
    while( true ) {
      if (p_Var11 == (_Rb_tree_node_base *)(local_8e8 + 8)) break;
      VRRStep::VRRStep((VRRStep *)local_6e8,(VRRStep *)(p_Var11 + 1));
      iVar6 = local_660;
      Quartet::amlist((QAM *)local_8b8,(Quartet *)auStack_6e0);
      pmVar12 = std::map<QAM,_int,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_int>_>_>::
                operator[](this_00,(QAM *)local_8b8);
      iVar3 = *pmVar12;
      if (*pmVar12 < iVar6) {
        iVar3 = iVar6;
      }
      Quartet::amlist((QAM *)local_818,(Quartet *)auStack_6e0);
      pmVar12 = std::map<QAM,_int,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_int>_>_>::
                operator[](this_00,(QAM *)local_818);
      *pmVar12 = iVar3;
      std::__cxx11::string::~string((string *)(local_818 + 0x10));
      std::__cxx11::string::~string((string *)&local_8a8);
      local_660 = 0;
      for (lVar15 = 0; lVar15 != 0x540; lVar15 = lVar15 + 0xa8) {
        pQVar1 = (Quartet *)((long)local_638[0].bra.left.ijk._M_elems + lVar15 + -4);
        Quartet::amlist((QAM *)local_8b8,pQVar1);
        pmVar12 = std::map<QAM,_int,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_int>_>_>::
                  operator[](this_00,(QAM *)local_8b8);
        iVar3 = *(int *)((long)(&local_638[0].ket + 1) + lVar15);
        iVar5 = *pmVar12;
        if (*pmVar12 < iVar3) {
          iVar5 = iVar3;
        }
        Quartet::amlist((QAM *)local_818,pQVar1);
        pmVar12 = std::map<QAM,_int,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_int>_>_>::
                  operator[](this_00,(QAM *)local_818);
        *pmVar12 = iVar5;
        std::__cxx11::string::~string((string *)(local_818 + 0x10));
        std::__cxx11::string::~string((string *)&local_8a8);
        piVar2 = (int *)((long)(&local_638[0].ket + 1) + lVar15);
        *piVar2 = *piVar2 - iVar6;
      }
      p_Var10 = (_Rb_tree<VRRStep,VRRStep,std::_Identity<VRRStep>,std::less<VRRStep>,std::allocator<VRRStep>>
                 *)std::
                   map<QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>_>
                   ::operator[](&this->vrrmap_,(key_type *)(p_Var8 + 1));
      std::
      _Rb_tree<VRRStep,VRRStep,std::_Identity<VRRStep>,std::less<VRRStep>,std::allocator<VRRStep>>::
      _M_insert_unique<VRRStep_const&>(p_Var10,(VRRStep *)local_6e8);
      VRRStep::~VRRStep((VRRStep *)local_6e8);
      p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
    }
    std::
    _Rb_tree<VRRStep,_VRRStep,_std::_Identity<VRRStep>,_std::less<VRRStep>,_std::allocator<VRRStep>_>
    ::~_Rb_tree((_Rb_tree<VRRStep,_VRRStep,_std::_Identity<VRRStep>,_std::less<VRRStep>,_std::allocator<VRRStep>_>
                 *)local_8e8);
  }
  local_6e8 = (undefined1  [8])0x0;
  auStack_6e0 = (undefined1  [8])0x0;
  local_6d8._M_p = (pointer)0x0;
  local_6c8[0]._8_8_ = (pointer)0x0;
  local_6d0._M_node = (_Base_ptr)local_6c8[0]._0_8_;
  std::__cxx11::string::string((string *)local_888._M_local_buf,"",(allocator *)local_8b8);
  local_8d8._M_p = local_8c8;
  local_8e8._0_8_ = 0;
  local_8e8._8_8_ = 0;
  if ((_Base_ptr)local_888._M_allocated_capacity == (_Base_ptr)local_878) {
    local_8c8._8_8_ = local_878._8_8_;
  }
  else {
    local_8d8._M_p = (pointer)local_888._M_allocated_capacity;
  }
  local_8d0 = (_Rb_tree_node_base *)local_888._8_8_;
  local_888._8_8_ = 0;
  local_878[0] = _S_red;
  local_888._M_allocated_capacity = (size_type)(_Base_ptr)local_878;
  this_02 = &std::
             map<QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>_>
             ::operator[](&this->vrrmap_,(key_type *)local_8e8)->_M_t;
  std::
  _Rb_tree<VRRStep,_VRRStep,_std::_Identity<VRRStep>,_std::less<VRRStep>,_std::allocator<VRRStep>_>
  ::operator=(this_02,(_Rb_tree<VRRStep,_VRRStep,_std::_Identity<VRRStep>,_std::less<VRRStep>,_std::allocator<VRRStep>_>
                       *)local_6e8);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::__cxx11::string::~string((string *)local_888._M_local_buf);
  std::
  _Rb_tree<VRRStep,_VRRStep,_std::_Identity<VRRStep>,_std::less<VRRStep>,_std::allocator<VRRStep>_>
  ::~_Rb_tree((_Rb_tree<VRRStep,_VRRStep,_std::_Identity<VRRStep>,_std::less<VRRStep>,_std::allocator<VRRStep>_>
               *)local_6e8);
  this->maxint_ = 0;
  p_Var8 = (this->vrrmap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_828 = &(this->vrrmap_)._M_t._M_impl.super__Rb_tree_header._M_header;
  this_01 = &this->qamint_2pq_;
  do {
    if (p_Var8 == local_828) {
      for (p_Var11 = (_Rb_tree_node_base *)local_7d8._72_8_;
          p_Var11 != (_Rb_tree_node_base *)(local_7d8 + 0x38);
          p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
        Quartet::amlist((QAM *)local_718,(Quartet *)(p_Var11 + 1));
        AMOrder_AddWithDependencies_(this,&this->amorder_,(QAM *)local_718);
        std::__cxx11::string::~string((string *)(local_718 + 0x10));
      }
      std::
      _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
      ::~_Rb_tree((_Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
                   *)local_7d8);
      std::
      _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
      ::~_Rb_tree(&local_778);
      std::
      _Rb_tree<QAM,_std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>,_std::_Select1st<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>_>
      ::~_Rb_tree(&local_748);
      std::
      _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
      ::~_Rb_tree((_Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
                   *)(local_7d8 + 0x30));
      return;
    }
    QAM::QAM((QAM *)local_6e8,(QAM *)(p_Var8 + 1));
    local_820 = p_Var8;
    for (p_Var11 = p_Var8[3]._M_parent; p_Var11 != (_Rb_tree_node_base *)&p_Var8[2]._M_right;
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
      piVar2 = (int *)((long)&p_Var11[0x30]._M_left + 4);
      _Var4 = *(_Rb_tree_color *)((long)&p_Var11[0x30]._M_left + 4);
      _Var14 = this->maxint_;
      if (this->maxint_ < (int)_Var4) {
        _Var14 = _Var4;
      }
      this->maxint_ = _Var14;
      __v_00 = (_Rb_tree_node_base *)&p_Var11[0x30]._M_right;
      if ((int)_Var14 < (int)*(_Rb_tree_color *)&p_Var11[0x30]._M_right) {
        _Var14 = *(_Rb_tree_color *)&p_Var11[0x30]._M_right;
      }
      this->maxint_ = _Var14;
      __v = (int *)((long)&p_Var11[0x30]._M_right + 4);
      _Var4 = *(_Rb_tree_color *)((long)&p_Var11[0x30]._M_right + 4);
      if ((int)_Var14 < (int)_Var4) {
        _Var14 = _Var4;
      }
      this->maxint_ = _Var14;
      if ((int)_Var14 < (int)p_Var11[0x31]._M_color) {
        _Var14 = p_Var11[0x31]._M_color;
      }
      this->maxint_ = _Var14;
      if (p_Var11[1]._M_color < 2) {
        bVar7 = Quartet::operator_cast_to_bool((Quartet *)(p_Var11 + 0x11));
        if (bVar7) {
LAB_0010d193:
          p_Var13 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                    std::
                    map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                    ::operator[](&this->qamint_2p_,(QAM *)local_6e8);
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>(p_Var13,piVar2);
        }
        else {
          bVar7 = Quartet::operator_cast_to_bool((Quartet *)&p_Var11[0x16]._M_parent);
          if (bVar7) goto LAB_0010d193;
        }
        bVar7 = Quartet::operator_cast_to_bool((Quartet *)&p_Var11[0x1b]._M_left);
        if (bVar7) {
LAB_0010d1cb:
          p_Var13 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                    std::
                    map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                    ::operator[](&this->qamint_2p_,(QAM *)local_6e8);
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>(p_Var13,(int *)__v_00);
        }
        else {
          bVar7 = Quartet::operator_cast_to_bool((Quartet *)&p_Var11[0x20]._M_right);
          if (bVar7) goto LAB_0010d1cb;
        }
        bVar7 = Quartet::operator_cast_to_bool((Quartet *)(p_Var11 + 0x26));
        if (bVar7) {
          p_Var13 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                    std::
                    map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                    ::operator[](this_01,(QAM *)local_6e8);
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>(p_Var13,__v);
        }
        bVar7 = Quartet::operator_cast_to_bool((Quartet *)&p_Var11[0x2b]._M_parent);
        if (bVar7) {
          p_Var13 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                    std::
                    map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                    ::operator[](this_01,(QAM *)local_6e8);
          __v_00 = p_Var11 + 0x31;
LAB_0010d2e2:
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>(p_Var13,(int *)__v_00);
        }
      }
      else {
        bVar7 = Quartet::operator_cast_to_bool((Quartet *)(p_Var11 + 0x11));
        if (bVar7) {
LAB_0010d24a:
          p_Var13 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                    std::
                    map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                    ::operator[](&this->qamint_2q_,(QAM *)local_6e8);
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>(p_Var13,__v);
        }
        else {
          bVar7 = Quartet::operator_cast_to_bool((Quartet *)&p_Var11[0x16]._M_parent);
          if (bVar7) goto LAB_0010d24a;
        }
        bVar7 = Quartet::operator_cast_to_bool((Quartet *)&p_Var11[0x1b]._M_left);
        if (bVar7) {
LAB_0010d282:
          p_Var13 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                    std::
                    map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                    ::operator[](&this->qamint_2q_,(QAM *)local_6e8);
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>(p_Var13,(int *)(p_Var11 + 0x31));
        }
        else {
          bVar7 = Quartet::operator_cast_to_bool((Quartet *)&p_Var11[0x20]._M_right);
          if (bVar7) goto LAB_0010d282;
        }
        bVar7 = Quartet::operator_cast_to_bool((Quartet *)(p_Var11 + 0x26));
        if (bVar7) {
          p_Var13 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                    std::
                    map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                    ::operator[](this_01,(QAM *)local_6e8);
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>(p_Var13,piVar2);
        }
        bVar7 = Quartet::operator_cast_to_bool((Quartet *)&p_Var11[0x2b]._M_parent);
        if (bVar7) {
          p_Var13 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                    std::
                    map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                    ::operator[](this_01,(QAM *)local_6e8);
          goto LAB_0010d2e2;
        }
      }
    }
    std::__cxx11::string::~string((string *)&local_6d8);
    p_Var8 = (_Base_ptr)std::_Rb_tree_increment(local_820);
  } while( true );
}

Assistant:

void OSTEI_VRR_Algorithm_Base::Create_WithOrder(const QuartetSet & q, IdxOrder idx_order)
{
    // holds the requirements for each am
    // so store what we initially want
    //PrintQuartetSet(q, "Initial VRR");

    // strip off the tags. They don't mean anything in VRR
    QuartetSet qnew;
    for(auto & it : q)
        qnew.insert(it.notag());


    VRR_StepMap newmap;

    // solved quartets
    QuartetSet solvedquartets;

    // unsolved quartets
    QuartetSet targets = qnew;
    PruneQuartets_(targets);

    for(int i = 0; i < 4; i++)
    {
        // check if we should stop
        if(idx_order[i] < 0)
            break;

        RRStepType rrstep = static_cast<RRStepType>(idx_order[i]);

        QuartetSet my_targets = targets;

        // set targets to be everything we aren't doing 
        targets = PruneQuartets_(my_targets, rrstep);

        while(my_targets.size())
        {
            QuartetSet newtargets;

            for(const auto & it : my_targets)
            {
                QAM qam = it.amlist();

                VRRStep vs = Create_Single_(it, rrstep);

                // add new targets
                for(const auto & it2 : vs.src)
                {
                    if(it2)
                    {
                        if(solvedquartets.count(it2) == 0)
                            newtargets.insert(it2);
                    }
                }

                newmap[qam].insert(vs);
                solvedquartets.insert(it);
            }

            // now get what I need to do
            my_targets = newtargets;
            QuartetSet not_for_me = PruneQuartets_(my_targets, rrstep);

            // add anything that is not my responsibility to the
            // main targets list. These might not be a part of
            // that list right now. 
            targets.insert(not_for_me.begin(),
                           not_for_me.end());
        }
    } 

    // save the solved quartets
    for(const auto & it : solvedquartets)
        allam_.insert(it.amlist());
    allam_.insert({0,0,0,0});

    // and we must do at least (s s | s s)^0
    vrrmreq_max_[{0,0,0,0}] = 0;

    // Handle the needed m values
    // For now, add all to the zero m value
    // but store the max m values needed
    for(auto & it : newmap)
    {
        VRR_StepSet vs = it.second;

        // notice it2 is a copy
        for(auto it2 : vs)
        {
            int m = it2.target.m;

            vrrmreq_max_[it2.target.amlist()] = std::max(m, vrrmreq_max_[it2.target.amlist()]);

            it2.target.m = 0;
            for(auto & mit : it2.src)
            {
                vrrmreq_max_[mit.amlist()] = std::max(mit.m, vrrmreq_max_[mit.amlist()]);
                mit.m -= m;
            }
   
            vrrmap_[it.first].insert(it2);
        } 
    }


    // and empty step list for s s s s
    vrrmap_[{0,0,0,0}] = VRR_StepSet();

    // determine requirements for all QAM
    // and the maximum integer constant
    maxint_ = 0;
    for(const auto & it : vrrmap_) // for all QAM
    {
        QAM qam = it.first;

        for(const auto & its : it.second)  // for all steps for this QAM
        {
            maxint_ = std::max(its.ijkl[0], maxint_);
            maxint_ = std::max(its.ijkl[1], maxint_);
            maxint_ = std::max(its.ijkl[2], maxint_);
            maxint_ = std::max(its.ijkl[3], maxint_);

            if(its.type == RRStepType::I || its.type == RRStepType::J)
            {
                if(its.src[2] || its.src[3])
                    qamint_2p_[qam].insert(its.ijkl[0]);

                if(its.src[4] || its.src[5])
                    qamint_2p_[qam].insert(its.ijkl[1]);

                if(its.src[6])
                    qamint_2pq_[qam].insert(its.ijkl[2]);

                if(its.src[7])
                    qamint_2pq_[qam].insert(its.ijkl[3]);
            }
            else
            {
                if(its.src[2] || its.src[3])
                    qamint_2q_[qam].insert(its.ijkl[2]);

                if(its.src[4] || its.src[5])
                    qamint_2q_[qam].insert(its.ijkl[3]);

                if(its.src[6])
                    qamint_2pq_[qam].insert(its.ijkl[0]);

                if(its.src[7])
                    qamint_2pq_[qam].insert(its.ijkl[1]);
            }
        }
    }


    // order the AM
    for(const auto & it : qnew) 
        AMOrder_AddWithDependencies_(amorder_, it.amlist());

}